

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_libapi.cpp
# Opt level: O0

ze_result_t
zeMemGetPitchFor2dImage
          (ze_context_handle_t hContext,ze_device_handle_t hDevice,size_t imageWidth,
          size_t imageHeight,uint elementSizeInBytes,size_t *rowPitch)

{
  ze_pfnMemGetPitchFor2dImage_t p_Var1;
  __pointer_type p_Var2;
  ze_pfnMemGetPitchFor2dImage_t pfnGetPitchFor2dImage;
  size_t *rowPitch_local;
  uint elementSizeInBytes_local;
  size_t imageHeight_local;
  size_t imageWidth_local;
  ze_device_handle_t hDevice_local;
  ze_context_handle_t hContext_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_ze_dditable_t_*>::load
                       ((atomic<_ze_dditable_t_*> *)(ze_lib::context + 0x10),memory_order_seq_cst);
    p_Var1 = (p_Var2->Mem).pfnGetPitchFor2dImage;
    if (p_Var1 == (ze_pfnMemGetPitchFor2dImage_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hContext_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hContext_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hContext_local._4_4_ =
           (*p_Var1)(hContext,hDevice,imageWidth,imageHeight,elementSizeInBytes,rowPitch);
    }
  }
  else {
    hContext_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hContext_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zeMemGetPitchFor2dImage(
    ze_context_handle_t hContext,                   ///< [in] handle of the context object
    ze_device_handle_t hDevice,                     ///< [in] handle of the device
    size_t imageWidth,                              ///< [in] imageWidth
    size_t imageHeight,                             ///< [in] imageHeight
    unsigned int elementSizeInBytes,                ///< [in] Element size in bytes
    size_t * rowPitch                               ///< [out] rowPitch
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const ze_pfnMemGetPitchFor2dImage_t pfnGetPitchFor2dImage = [&result] {
        auto pfnGetPitchFor2dImage = ze_lib::context->zeDdiTable.load()->Mem.pfnGetPitchFor2dImage;
        if( nullptr == pfnGetPitchFor2dImage ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnGetPitchFor2dImage;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnGetPitchFor2dImage( hContext, hDevice, imageWidth, imageHeight, elementSizeInBytes, rowPitch );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnGetPitchFor2dImage = ze_lib::context->zeDdiTable.load()->Mem.pfnGetPitchFor2dImage;
    if( nullptr == pfnGetPitchFor2dImage ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnGetPitchFor2dImage( hContext, hDevice, imageWidth, imageHeight, elementSizeInBytes, rowPitch );
    #endif
}